

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetConfidentialTxInPeginWitnessCount
              (void *handle,char *tx_hex_string,uint32_t txin_index,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  ConfidentialTxInReference ref;
  ConfidentialTransactionContext tx;
  allocator local_249;
  ConfidentialTxInReference local_248;
  ConfidentialTransactionContext local_e8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_248,tx_hex_string,&local_249);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              (&local_e8,(string *)&local_248);
    if ((ByteData *)local_248.super_AbstractTxInReference._vptr_AbstractTxInReference !=
        &local_248.super_AbstractTxInReference.txid_.data_) {
      operator_delete(local_248.super_AbstractTxInReference._vptr_AbstractTxInReference);
    }
    cfd::core::ConfidentialTransaction::GetTxIn
              (&local_248,&local_e8.super_ConfidentialTransaction,txin_index);
    if (count != (uint32_t *)0x0) {
      uVar2 = cfd::core::ScriptWitness::GetWitnessNum(&local_248.pegin_witness_);
      *count = uVar2;
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_248);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
    return 0;
  }
  local_248.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5e1cf2;
  local_248.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x32e;
  local_248.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetConfidentialTxInPeginWitnessCount";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_248,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_248.super_AbstractTxInReference._vptr_AbstractTxInReference =
       (_func_int **)&local_248.super_AbstractTxInReference.txid_.data_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_248);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInPeginWitnessCount(
    void* handle, const char* tx_hex_string, uint32_t txin_index,
    uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    const ConfidentialTxInReference ref = tx.GetTxIn(txin_index);
    if (count != nullptr) {
      *count = ref.GetPeginWitnessStackNum();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}